

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O3

string * __thiscall
duckdb::Decimal::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Decimal *this,hugeint_t value,uint8_t width,uint8_t scale)

{
  undefined4 in_EAX;
  uint uVar1;
  void *pvVar2;
  undefined7 in_register_00000081;
  hugeint_t value_00;
  hugeint_t value_01;
  idx_t len;
  
  len = CONCAT44((int)CONCAT71(in_register_00000081,width),in_EAX);
  value_00.upper._4_4_ = 0;
  value_00._0_12_ = value._0_12_;
  uVar1 = DecimalToString::DecimalLength<duckdb::hugeint_t>
                    ((DecimalToString *)this,value_00,width,width);
  pvVar2 = operator_new__((long)(int)(uVar1 + 1));
  value_01.upper._4_4_ = 0;
  value_01._0_12_ = value._0_12_;
  DecimalToString::FormatDecimal<duckdb::hugeint_t>
            ((DecimalToString *)this,value_01,(uint8_t)(len >> 0x20),(uint8_t)pvVar2,
             (char *)(long)(int)uVar1,len);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar2,(long)pvVar2 + (ulong)uVar1);
  operator_delete__(pvVar2);
  return __return_storage_ptr__;
}

Assistant:

string Decimal::ToString(hugeint_t value, uint8_t width, uint8_t scale) {
	auto len = DecimalToString::DecimalLength(value, width, scale);
	auto data = make_unsafe_uniq_array_uninitialized<char>(UnsafeNumericCast<size_t>(len + 1));
	DecimalToString::FormatDecimal(value, width, scale, data.get(), UnsafeNumericCast<idx_t>(len));
	return string(data.get(), UnsafeNumericCast<uint32_t>(len));
}